

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kern.cxx
# Opt level: O1

void HAXX::Kern<HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>>
               (int32_t M,int32_t N,int32_t K,quaternion<double> *A,quaternion<double> *B,
               quaternion<double> *C,int32_t LDC)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  quaternion<double> qVar8;
  undefined1 auVar9 [32];
  quaternion<double> qVar11;
  undefined1 auVar12 [32];
  undefined1 auVar14 [64];
  quaternion<double> qVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar10 [64];
  undefined1 auVar13 [64];
  
  qVar11 = (quaternion<double>)(SUB6432(ZEXT864(0),0) << 0x40);
  qVar8 = (quaternion<double>)(SUB6432(ZEXT864(0),0) << 0x40);
  if (M == 2) {
    qVar8 = C[1];
  }
  if (N == 2) {
    qVar11 = C[LDC];
  }
  qVar15 = (quaternion<double>)(ZEXT832(0) << 0x40);
  if (M == 2 && N == 2) {
    qVar15 = C[(long)LDC + 1];
  }
  auVar18 = vunpcklpd_avx((undefined1  [32])*C,(undefined1  [32])qVar11);
  auVar16 = vunpckhpd_avx((undefined1  [32])*C,(undefined1  [32])qVar11);
  auVar2 = vunpcklpd_avx((undefined1  [32])qVar8,(undefined1  [32])qVar15);
  auVar20 = vunpckhpd_avx((undefined1  [32])qVar8,(undefined1  [32])qVar15);
  auVar9._16_16_ = auVar2._0_16_;
  auVar9._0_16_ = auVar18._0_16_;
  auVar10 = ZEXT3264(auVar9);
  auVar12._16_16_ = auVar20._0_16_;
  auVar12._0_16_ = auVar16._0_16_;
  auVar13 = ZEXT3264(auVar12);
  auVar18 = vperm2f128_avx(auVar18,auVar2,0x31);
  auVar14 = ZEXT3264(auVar18);
  auVar16 = vperm2f128_avx(auVar16,auVar20,0x31);
  auVar17 = ZEXT3264(auVar16);
  if (0 < K) {
    iVar6 = K + 1;
    lVar7 = 0;
    do {
      auVar16 = *(undefined1 (*) [32])((long)&A->_M_real + lVar7);
      auVar20 = *(undefined1 (*) [32])((long)&A[1]._M_real + lVar7);
      auVar2 = vshufpd_avx(auVar16,auVar16,0xf);
      auVar18._8_8_ = auVar16._0_8_;
      auVar18._0_8_ = auVar16._0_8_;
      auVar18._16_8_ = auVar16._16_8_;
      auVar18._24_8_ = auVar16._16_8_;
      auVar16 = vshufpd_avx(auVar20,auVar20,0xf);
      auVar19._8_8_ = auVar20._0_8_;
      auVar19._0_8_ = auVar20._0_8_;
      auVar19._16_8_ = auVar20._16_8_;
      auVar19._24_8_ = auVar20._16_8_;
      auVar1 = *(undefined1 (*) [16])((long)&B->_M_real + lVar7);
      auVar20._16_16_ = auVar1;
      auVar20._0_16_ = auVar1;
      auVar1 = *(undefined1 (*) [16])((long)&B[1]._M_real + lVar7);
      auVar21._16_16_ = auVar1;
      auVar21._0_16_ = auVar1;
      auVar1 = *(undefined1 (*) [16])((long)&B->_M_imag_j + lVar7);
      auVar22._16_16_ = auVar1;
      auVar22._0_16_ = auVar1;
      auVar1 = *(undefined1 (*) [16])((long)&B[1]._M_imag_j + lVar7);
      auVar23._16_16_ = auVar1;
      auVar23._0_16_ = auVar1;
      auVar1 = vfmadd231pd_fma(auVar10._0_32_,auVar18,auVar20);
      auVar3 = vfmadd231pd_fma(auVar13._0_32_,auVar18,auVar21);
      auVar4 = vfmadd231pd_fma(auVar14._0_32_,auVar18,auVar22);
      auVar5 = vfmadd231pd_fma(auVar17._0_32_,auVar23,auVar18);
      auVar1 = vfnmadd231pd_fma(ZEXT1632(auVar1),auVar2,auVar21);
      auVar1 = vfnmadd231pd_fma(ZEXT1632(auVar1),auVar19,auVar22);
      auVar1 = vfnmadd231pd_fma(ZEXT1632(auVar1),auVar16,auVar23);
      auVar10 = ZEXT1664(auVar1);
      auVar9 = ZEXT1632(auVar1);
      auVar1 = vfmadd231pd_fma(ZEXT1632(auVar3),auVar2,auVar20);
      auVar1 = vfmadd231pd_fma(ZEXT1632(auVar1),auVar19,auVar23);
      auVar1 = vfnmadd231pd_fma(ZEXT1632(auVar1),auVar16,auVar22);
      auVar13 = ZEXT1664(auVar1);
      auVar12 = ZEXT1632(auVar1);
      auVar1 = vfnmadd231pd_fma(ZEXT1632(auVar4),auVar2,auVar23);
      auVar1 = vfmadd231pd_fma(ZEXT1632(auVar1),auVar19,auVar20);
      auVar1 = vfmadd231pd_fma(ZEXT1632(auVar1),auVar16,auVar21);
      auVar14 = ZEXT1664(auVar1);
      auVar18 = ZEXT1632(auVar1);
      auVar1 = vfmadd231pd_fma(ZEXT1632(auVar5),auVar2,auVar22);
      auVar1 = vfnmadd231pd_fma(ZEXT1632(auVar1),auVar19,auVar21);
      auVar1 = vfmadd231pd_fma(ZEXT1632(auVar1),auVar16,auVar20);
      auVar17 = ZEXT1664(auVar1);
      auVar16 = ZEXT1632(auVar1);
      iVar6 = iVar6 + -1;
      lVar7 = lVar7 + 0x40;
    } while (1 < iVar6);
  }
  auVar20 = vunpcklpd_avx(auVar9,auVar12);
  auVar2 = vunpcklpd_avx(auVar18,auVar16);
  qVar8._M_imag_j = (double)SUB168(auVar2._0_16_,0);
  qVar8._M_imag_k = (double)SUB168(auVar2._0_16_,8);
  qVar8._M_real = (double)SUB168(auVar20._0_16_,0);
  qVar8._M_imag_i = (double)SUB168(auVar20._0_16_,8);
  *C = qVar8;
  if (M == 2) {
    qVar8 = (quaternion<double>)vperm2f128_avx(auVar20,auVar2,0x31);
    C[1] = qVar8;
  }
  auVar16 = vunpckhpd_avx(auVar18,auVar16);
  auVar20 = vunpckhpd_avx(auVar9,auVar12);
  if (N == 2) {
    qVar11._M_imag_j = (double)SUB168(auVar16._0_16_,0);
    qVar11._M_imag_k = (double)SUB168(auVar16._0_16_,8);
    qVar11._M_real = (double)SUB168(auVar20._0_16_,0);
    qVar11._M_imag_i = (double)SUB168(auVar20._0_16_,8);
    C[LDC] = qVar11;
  }
  if (M == 2 && N == 2) {
    qVar8 = (quaternion<double>)vperm2f128_avx(auVar20,auVar16,0x31);
    C[(long)LDC + 1] = qVar8;
  }
  return;
}

Assistant:

void Kern(HAXX_INT M, HAXX_INT N, HAXX_INT K, 
  quaternion<double>* __restrict__ A, quaternion<double>* __restrict__ B, 
  quaternion<double>* __restrict__ C, HAXX_INT LDC) {

  __m256d t1,t2,t3,t4;

  const bool M2 = (M == 2);
  const bool N2 = (N == 2);

  // Load C
  __m256d c00 = LOAD_256D_UNALIGNED_AS(double,C      );

  __m256d c10 = M2 ? LOAD_256D_UNALIGNED_AS(double,C+1    ) :
                           _mm256_setzero_pd();

  __m256d c01 = N2 ? LOAD_256D_UNALIGNED_AS(double,C+LDC  ) :
                           _mm256_setzero_pd();

  __m256d c11 = ( M2 and N2 ) ?  LOAD_256D_UNALIGNED_AS(double,C+LDC+1) :
                                 _mm256_setzero_pd();

  _MM_TRANSPOSE_4x4_PD(c00,c01,c10,c11,t1,t2,t3,t4);


  quaternion<double> *locB = B, *locA = A;

  HAXX_INT k = K;

  if( k > 0 )
  do {

    // Load A 
    __m256d a00 = LOAD_256D_ALIGNED_AS(double,locA);
    __m256d a10 = LOAD_256D_ALIGNED_AS(double,locA+1);
    locA += 2;
    

    // Load B

#ifndef _FACTOR_TRANSPOSE_INTO_B_PACK
    __m256d b00 = LOAD_256D_ALIGNED_AS(double,locB);
    __m256d b10 = LOAD_256D_ALIGNED_AS(double,locB+1);
#else
    double *BasDouble = reinterpret_cast<double*>(locB);
    __m128d b00lo = LOAD_128D_ALIGNED(BasDouble);
    __m128d b00hi = LOAD_128D_ALIGNED(BasDouble+2);
    __m128d b10lo = LOAD_128D_ALIGNED(BasDouble+4);
    __m128d b10hi = LOAD_128D_ALIGNED(BasDouble+6);
#endif
    locB += 2;


#ifdef _FACTOR_TRANSPOSE_INTO_A_PACK

    __m256d a_IIII = _mm256_permute_pd(a00,0xF);
    a00            = _mm256_permute_pd(a00,0x0); // SSSS
  
    __m256d a_KKKK = _mm256_permute_pd(a10,0xF);
    a10            = _mm256_permute_pd(a10,0x0); // SSSS

    __m256d &a00c = a_IIII;
    __m256d &a10c = a_KKKK;

#else

    __m256d a00c = a00;
    __m256d a10c = a10;
    _MM_TRANSPOSE_4x4_PD(a00,a00c,a10,a10c,t1,t2,t3,t4);

#endif

#ifdef _FACTOR_TRANSPOSE_INTO_B_PACK

    __m256d bSSSS = SET_256D_FROM_128D(b00lo,b00lo);
    __m256d bIIII = SET_256D_FROM_128D(b10lo,b10lo);
    __m256d bJJJJ = SET_256D_FROM_128D(b00hi,b00hi);
    __m256d bKKKK = SET_256D_FROM_128D(b10hi,b10hi);

    __m256d &b00  = bSSSS;
    __m256d &b10  = bIIII;
    __m256d &b00c = bJJJJ;
    __m256d &b10c = bKKKK;

#else

    __m256d b00c = b00;
    __m256d b10c = b10;
    _MM_TRANSPOSE_4x4_PD(b00,b10,b00c,b10c,t1,t2,t3,t4);

#endif

    INC_MULD4Q_NN(a00,a00c,a10,a10c,b00,b10,b00c,b10c,c00,c01,c10,c11);
  

    k--;
  } while( k > 0 );

  _MM_TRANSPOSE_4x4_PD(c00,c01,c10,c11,t1,t2,t3,t4);

  STORE_256D_UNALIGNED_AS(double,C      ,c00);
  if( M2 ) STORE_256D_UNALIGNED_AS(double,C+1    ,c10);
  if( N2 ) STORE_256D_UNALIGNED_AS(double,C+LDC  ,c01);
  if( M2 and N2 ) STORE_256D_UNALIGNED_AS(double,C+LDC+1,c11);
  

}